

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void rotate_matrix(float angle,float x,float y,float z,float *r)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dd;
  float fVar11;
  undefined4 in_XMM2_Db;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined8 local_40;
  float local_38;
  float local_30;
  float local_2c;
  float local_28;
  undefined4 uStack_24;
  undefined4 uStack_1c;
  float local_18;
  undefined4 uStack_14;
  undefined4 uVar10;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  
  fVar7 = (angle * 3.1415927) / 180.0;
  local_28 = x;
  uStack_24 = in_XMM1_Db;
  uStack_1c = in_XMM1_Dd;
  local_18 = y;
  uStack_14 = in_XMM2_Db;
  local_2c = (float)SDL_cosf();
  local_30 = (float)SDL_sinf(fVar7);
  fVar7 = (float)SDL_cosf(fVar7);
  dVar9 = (double)SDL_sqrt(SUB84((double)(local_28 * local_28 + local_18 * local_18),0));
  uVar10 = (undefined4)((ulong)dVar9 >> 0x20);
  fVar8 = (float)dVar9;
  auVar13._4_4_ = uStack_24;
  auVar13._0_4_ = local_28;
  auVar13._8_4_ = uStack_24;
  auVar13._12_4_ = uStack_1c;
  auVar12._8_8_ = auVar13._8_8_;
  auVar12._4_4_ = local_18;
  auVar12._0_4_ = local_28;
  auVar14._0_12_ = auVar12._0_12_;
  auVar14._12_4_ = uStack_14;
  auVar15._4_4_ = fVar8;
  auVar15._0_4_ = fVar8;
  auVar15._8_4_ = uVar10;
  auVar15._12_4_ = uVar10;
  auVar15 = divps(auVar14,auVar15);
  local_40 = auVar15._0_8_;
  local_38 = 0.0 / fVar8;
  r[0] = 0.0;
  r[1] = 0.0;
  r[2] = 0.0;
  r[3] = 0.0;
  r[4] = 0.0;
  r[5] = 0.0;
  r[6] = 0.0;
  r[7] = 0.0;
  r[8] = 0.0;
  r[9] = 0.0;
  r[10] = 0.0;
  r[0xb] = 0.0;
  r[0xb] = 0.0;
  r[0xc] = 0.0;
  r[0xd] = 0.0;
  r[0xe] = 0.0;
  r[0xf] = 1.0;
  lVar5 = 0;
  uVar6 = 0;
  do {
    iVar4 = (int)lVar5;
    uVar1 = uVar6 - 1;
    if (iVar4 == 0) {
      uVar1 = 2;
    }
    uVar6 = uVar6 + 1;
    uVar2 = uVar6;
    if (uVar6 == 3) {
      uVar2 = 0;
    }
    lVar3 = lVar5 + (ulong)uVar2;
    lVar5 = lVar5 + 4;
    r[lVar3] = *(float *)((long)&local_40 + (ulong)uVar1 * 4) * local_30;
    r[iVar4 + uVar1] = -*(float *)((long)&local_40 + (ulong)uVar2 * 4) * local_30;
  } while (uVar6 != 3);
  lVar5 = 0;
  do {
    fVar8 = *(float *)((long)&local_40 + lVar5 * 4);
    lVar3 = 0;
    do {
      fVar11 = local_2c;
      if (lVar5 != lVar3) {
        fVar11 = 0.0;
      }
      r[lVar3] = *(float *)((long)&local_40 + lVar3 * 4) * fVar8 * (1.0 - fVar7) + fVar11 + r[lVar3]
      ;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar5 = lVar5 + 1;
    r = r + 4;
  } while (lVar5 != 3);
  return;
}

Assistant:

static void
rotate_matrix(float angle, float x, float y, float z, float *r)
{
    float radians, c, s, c1, u[3], length;
    int i, j;

    radians = (float)(angle * M_PI) / 180.0f;

    c = SDL_cosf(radians);
    s = SDL_sinf(radians);

    c1 = 1.0f - SDL_cosf(radians);

    length = (float)SDL_sqrt(x * x + y * y + z * z);

    u[0] = x / length;
    u[1] = y / length;
    u[2] = z / length;

    for (i = 0; i < 16; i++) {
        r[i] = 0.0;
    }

    r[15] = 1.0;

    for (i = 0; i < 3; i++) {
        r[i * 4 + (i + 1) % 3] = u[(i + 2) % 3] * s;
        r[i * 4 + (i + 2) % 3] = -u[(i + 1) % 3] * s;
    }

    for (i = 0; i < 3; i++) {
        for (j = 0; j < 3; j++) {
            r[i * 4 + j] += c1 * u[i] * u[j] + (i == j ? c : 0.0f);
        }
    }
}